

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O1

void s98c_write(s98c *ctx,uint8_t n)

{
  uint8_t *puVar1;
  uint8_t *__ptr;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  size_t __size;
  long lVar5;
  
  puVar1 = ctx->p;
  __ptr = ctx->dump_buffer;
  if (__ptr + ctx->dump_size <= puVar1) {
    puVar2 = ctx->loop_start;
    lVar5 = (long)ctx->dump_start - (long)__ptr;
    if (ctx->dump_start == (uint8_t *)0x0) {
      lVar5 = 0;
    }
    __size = ctx->dump_size + 0x4000;
    ctx->dump_size = __size;
    puVar3 = (uint8_t *)realloc(__ptr,__size);
    ctx->dump_buffer = puVar3;
    ctx->p = puVar3 + ((long)puVar1 - (long)__ptr);
    if (ctx->loop_start != (uint8_t *)0x0) {
      lVar4 = (long)puVar2 - (long)__ptr;
      if (puVar2 == (uint8_t *)0x0) {
        lVar4 = 0;
      }
      ctx->loop_start = puVar3 + lVar4;
    }
    if (ctx->dump_start != (uint8_t *)0x0) {
      ctx->dump_start = puVar3 + lVar5;
    }
  }
  puVar1 = ctx->p;
  ctx->p = puVar1 + 1;
  *puVar1 = n;
  return;
}

Assistant:

void s98c_write(struct s98c* ctx, uint8_t n)
{
    if(ctx->p >= ctx->dump_buffer + ctx->dump_size) {
        ptrdiff_t p_offset = ctx->p - ctx->dump_buffer;
        ptrdiff_t loop_offset = 0, dump_offset = 0;

        if(ctx->loop_start != NULL) {
            loop_offset = ctx->loop_start - ctx->dump_buffer;
        }
        if(ctx->dump_start != NULL) {
            dump_offset = ctx->dump_start - ctx->dump_buffer;
        }

        ctx->dump_size += DUMP_SIZE_INCREMENT;
        ctx->dump_buffer = realloc(ctx->dump_buffer, ctx->dump_size);

        ctx->p = ctx->dump_buffer + p_offset;
        if(ctx->loop_start != NULL) {
            ctx->loop_start = ctx->dump_buffer + loop_offset;
        }
        if(ctx->dump_start != NULL) {
            ctx->dump_start = ctx->dump_buffer + dump_offset;
        }
    }
    
    *ctx->p++ = n;
}